

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.cpp
# Opt level: O3

char * __thiscall soul::UTF8Reader::findInvalidData(UTF8Reader *this)

{
  byte *pbVar1;
  byte bVar2;
  UnicodeChar UVar3;
  byte *pbVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  UTF8Reader local_38;
  
  pbVar4 = (byte *)this->data;
  bVar2 = *pbVar4;
  do {
    if (bVar2 == 0) {
      return (char *)0x0;
    }
    pbVar1 = pbVar4 + 1;
    if ((char)bVar2 < '\0') {
      if ((bVar2 & 0x40) == 0) {
        return (char *)pbVar4;
      }
      uVar7 = 0x40;
      iVar5 = 0;
      lVar6 = -1;
      do {
        if (iVar5 == 4) {
          return (char *)pbVar4;
        }
        uVar7 = uVar7 >> 1;
        if ((uVar7 == 8) &&
           (local_38.data = (char *)(pbVar4 + 1), UVar3 = operator*(&local_38), 0x10ffff < UVar3)) {
          return (char *)pbVar4;
        }
        lVar6 = lVar6 + -1;
        iVar5 = iVar5 + 1;
      } while ((uVar7 & bVar2) != 0);
      pbVar1 = pbVar4 + -lVar6;
      if (0 < iVar5) {
        return (char *)pbVar4;
      }
    }
    pbVar4 = pbVar1;
    bVar2 = *pbVar4;
  } while( true );
}

Assistant:

const char* UTF8Reader::findInvalidData() const
{
    for (auto t = data; *t != 0;)
    {
        auto byte = (signed char) *t++;

        if (byte < 0)
        {
            auto errorPos = t - 1;
            int bit = 0x40;
            int numExtraValues = 0;

            while ((byte & bit) != 0)
            {
                if (bit < 8)
                    return errorPos;

                ++numExtraValues;
                bit >>= 1;

                if (bit == 8 && *UTF8Reader (t) > 0x10ffff)
                    return errorPos;
            }

            if (numExtraValues == 0)
                return errorPos;

            while (--numExtraValues >= 0)
                if ((*t++ & 0xc0) != 0x80)
                    return errorPos;
        }
    }

    return nullptr;
}